

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_limb_t mpn_addmul_1(mp_ptr rp,mp_srcptr up,mp_size_t n,mp_limb_t vl)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  mp_limb_t __v;
  mp_limb_t __u;
  uint __vh;
  uint __uh;
  uint __vl;
  uint __ul;
  mp_limb_t __x3;
  mp_limb_t __x2;
  mp_limb_t __x1;
  mp_limb_t __x0;
  mp_limb_t rl;
  mp_limb_t lpl;
  mp_limb_t hpl;
  mp_limb_t cl;
  mp_limb_t ul;
  mp_limb_t vl_local;
  mp_size_t n_local;
  mp_srcptr up_local;
  mp_ptr rp_local;
  
  if (0 < n) {
    hpl = 0;
    vl_local = n;
    n_local = (mp_size_t)up;
    up_local = rp;
    do {
      uVar5 = *(ulong *)n_local;
      uVar1 = (uint)(uVar5 >> 0x20);
      uVar2 = (uint)(vl >> 0x20);
      uVar3 = (uVar5 & 0xffffffff) * (vl & 0xffffffff);
      uVar4 = (ulong)uVar1 * (vl & 0xffffffff);
      ___vl = (ulong)uVar1 * (ulong)uVar2;
      uVar5 = uVar4 + (uVar3 >> 0x20) + (uVar5 & 0xffffffff) * (ulong)uVar2;
      if (uVar5 < uVar4) {
        ___vl = ___vl + 0x100000000;
      }
      uVar3 = hpl + (uVar5 << 0x20) + (uVar3 & 0xffffffff);
      uVar4 = *up_local + uVar3;
      hpl = (long)(int)(uint)(uVar4 < *up_local) +
            (long)(int)(uint)(uVar3 < hpl) + ___vl + (uVar5 >> 0x20);
      *up_local = uVar4;
      vl_local = vl_local - 1;
      n_local = n_local + 8;
      up_local = up_local + 1;
    } while (vl_local != 0);
    return hpl;
  }
  __assert_fail("n >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x20f,"mp_limb_t mpn_addmul_1(mp_ptr, mp_srcptr, mp_size_t, mp_limb_t)");
}

Assistant:

mp_limb_t
mpn_addmul_1 (mp_ptr rp, mp_srcptr up, mp_size_t n, mp_limb_t vl)
{
  mp_limb_t ul, cl, hpl, lpl, rl;

  assert (n >= 1);

  cl = 0;
  do
    {
      ul = *up++;
      gmp_umul_ppmm (hpl, lpl, ul, vl);

      lpl += cl;
      cl = (lpl < cl) + hpl;

      rl = *rp;
      lpl = rl + lpl;
      cl += lpl < rl;
      *rp++ = lpl;
    }
  while (--n != 0);

  return cl;
}